

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeH1.cpp
# Opt level: O1

void TPZShapeH1<pzshape::TPZShapeQuad>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZShapeData *data)

{
  int *piVar1;
  ulong uVar2;
  int *piVar3;
  long *plVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  long newRows;
  TPZManVector<int,_27> local_c0;
  
  if ((ids->fNElements == 4) && (connectorders->fNElements == 5)) {
    local_c0.super_TPZVec<int>.fStore = (int *)0x0;
    local_c0.super_TPZVec<int>.fNElements = 0;
    local_c0.super_TPZVec<int>.fNAlloc = 0;
    local_c0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01840098;
    uVar2 = connectorders->fNElements;
    if ((long)uVar2 < 0x1c) {
      local_c0.super_TPZVec<int>.fStore = local_c0.fExtAlloc;
      local_c0.super_TPZVec<int>.fNAlloc = 0;
    }
    else {
      local_c0.super_TPZVec<int>.fStore =
           (int *)operator_new__(-(ulong)(uVar2 >> 0x3e != 0) | uVar2 * 4);
      local_c0.super_TPZVec<int>.fNAlloc = uVar2;
    }
    piVar1 = local_c0.fExtAlloc;
    if (0 < (long)uVar2) {
      piVar3 = connectorders->fStore;
      uVar6 = 0;
      do {
        local_c0.super_TPZVec<int>.fStore[uVar6] = piVar3[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar2 != uVar6);
    }
    local_c0.super_TPZVec<int>.fNElements = uVar2;
    TPZManVector<int,_27>::operator=(&data->fH1ConnectOrders,&local_c0);
    if (local_c0.super_TPZVec<int>.fStore == piVar1) {
      local_c0.super_TPZVec<int>.fStore = (int *)0x0;
    }
    local_c0.super_TPZVec<int>.fNAlloc = 0;
    local_c0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
    if (local_c0.super_TPZVec<int>.fStore != (int *)0x0) {
      operator_delete__(local_c0.super_TPZVec<int>.fStore);
    }
    ComputeTransforms<pzshape::TPZShapeQuad>
              (ids,&(data->fSideTransforms).super_TPZVec<TPZTransform<double>_>);
    local_c0.super_TPZVec<int>.fStore = (int *)0x0;
    local_c0.super_TPZVec<int>.fNElements = 0;
    local_c0.super_TPZVec<int>.fNAlloc = 0;
    local_c0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01840b58;
    uVar2 = ids->fNElements;
    if ((long)uVar2 < 9) {
      local_c0.super_TPZVec<int>.fStore = piVar1;
      local_c0.super_TPZVec<int>.fNAlloc = 0;
    }
    else {
      local_c0.super_TPZVec<int>.fStore =
           (int *)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | uVar2 * 8);
      local_c0.super_TPZVec<int>.fNAlloc = uVar2;
    }
    if (0 < (long)uVar2) {
      plVar4 = ids->fStore;
      uVar6 = 0;
      do {
        *(long *)(local_c0.super_TPZVec<int>.fStore + uVar6 * 2) = plVar4[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar2 != uVar6);
    }
    local_c0.super_TPZVec<int>.fNElements = uVar2;
    TPZManVector<long,_8>::operator=(&data->fCornerNodeIds,(TPZManVector<long,_8> *)&local_c0);
    if (local_c0.super_TPZVec<int>.fStore == piVar1) {
      local_c0.super_TPZVec<int>.fStore = (int *)0x0;
    }
    local_c0.super_TPZVec<int>.fNAlloc = 0;
    local_c0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
    if (local_c0.super_TPZVec<int>.fStore != (int *)0x0) {
      operator_delete__(local_c0.super_TPZVec<int>.fStore);
    }
    (*(data->fH1NumConnectShape).super_TPZVec<int>._vptr_TPZVec[3])(&data->fH1NumConnectShape,5);
    newRows = 4;
    lVar7 = 0;
    do {
      iVar5 = pzshape::TPZShapeQuad::NConnectShapeF((int)lVar7 + 4,connectorders->fStore[lVar7]);
      (data->fH1NumConnectShape).super_TPZVec<int>.fStore[lVar7] = iVar5;
      newRows = newRows + iVar5;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 5);
    TPZFMatrix<double>::Resize(&(data->fPhi).super_TPZFMatrix<double>,newRows,1);
    TPZFMatrix<double>::Resize(&(data->fDPhi).super_TPZFMatrix<double>,2,newRows);
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeH1.cpp"
             ,0x15);
}

Assistant:

void TPZShapeH1<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                           const TPZVec<int> &connectorders,
                                           TPZShapeData &data) {
    const int ncorner = TSHAPE::NCornerNodes;
    const int nsides = TSHAPE::NSides;
    if((ids.size() != ncorner || connectorders.size() != nsides-ncorner) && TSHAPE::Type() != EPoint)
    {
        DebugStop();
    }
    data.fH1ConnectOrders = connectorders;
    ComputeTransforms<TSHAPE>(ids, data.fSideTransforms);
    data.fCornerNodeIds = ids;
    data.fH1NumConnectShape.resize(TSHAPE::NSides-TSHAPE::NCornerNodes);
    int64_t nshape = TSHAPE::NCornerNodes;
    for(int i = TSHAPE::NCornerNodes; i < TSHAPE::NSides; i++)
    {
        int nshapeconnect = TSHAPE::NConnectShapeF(i,connectorders[i-TSHAPE::NCornerNodes]);
        data.fH1NumConnectShape[i-TSHAPE::NCornerNodes] = nshapeconnect;
        nshape += nshapeconnect;
    }
    data.fPhi.Resize(nshape,1);
    data.fDPhi.Resize(TSHAPE::Dimension, nshape);
//    fNodeIds = ids; Should we make it an attribute of the class?
}